

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O3

void Ptex::v2_2::PtexUtils::anon_unknown_1::average<unsigned_short>
               (unsigned_short *src,int sstride,int uw,int vw,unsigned_short *dst,int nchan)

{
  unsigned_short *puVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  unsigned_short *puVar5;
  void *__s;
  undefined8 uStack_40;
  float local_38;
  int local_34;
  
  lVar4 = -((long)nchan * 4 + 0xfU & 0xfffffffffffffff0);
  __s = (void *)((long)&local_38 + lVar4);
  local_38 = (float)vw;
  local_34 = uw;
  *(undefined8 *)((long)&uStack_40 + lVar4) = 0x5ee18f;
  memset(__s,0,(long)nchan << 2);
  iVar2 = (sstride / 2) * (int)local_38;
  if (iVar2 != 0) {
    puVar1 = src + iVar2;
    iVar2 = nchan * local_34;
    do {
      puVar5 = src;
      if (iVar2 != 0) {
        puVar5 = src + iVar2;
        do {
          if (0 < nchan) {
            lVar4 = 0;
            do {
              *(float *)((long)__s + lVar4 * 2) =
                   (float)*(ushort *)((long)src + lVar4) + *(float *)((long)__s + lVar4 * 2);
              lVar4 = lVar4 + 2;
            } while ((ulong)(uint)nchan * 2 != lVar4);
            src = (unsigned_short *)((long)src + lVar4);
          }
        } while (src != puVar5);
      }
      src = puVar5 + (sstride / 2 - iVar2);
    } while (src != puVar1);
  }
  if (0 < nchan) {
    uVar3 = 0;
    do {
      dst[uVar3] = (unsigned_short)
                   (int)(*(float *)((long)__s + uVar3 * 4) *
                        (1.0 / (float)((int)local_38 * local_34)));
      uVar3 = uVar3 + 1;
    } while ((uint)nchan != uVar3);
  }
  return;
}

Assistant:

inline void average(const T* src, int sstride, int uw, int vw,
                        T* dst, int nchan)
    {
        float* buff = (float*) alloca(nchan*sizeof(float));
        memset(buff, 0, nchan*sizeof(float));
        sstride /= (int)sizeof(T);
        int rowlen = uw*nchan;
        int rowskip = sstride - rowlen;
        for (const T* end = src + vw*sstride; src != end; src += rowskip)
            for (const T* rowend = src + rowlen; src != rowend;)
                for (int i = 0; i < nchan; i++) buff[i] += (float)*src++;
        float scale = 1.0f/(float)(uw*vw);
        for (int i = 0; i < nchan; i++) dst[i] = T(buff[i]*scale);
    }